

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O1

void Gli_ManSetPiRandom(Gli_Man_t *p,float PiTransProb)

{
  int *piVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  
  if ((0.0 < PiTransProb) && (PiTransProb < 1.0)) {
    p->vCisChanged->nSize = 0;
    pVVar3 = p->vCis;
    if (0 < pVVar3->nSize) {
      lVar5 = 0;
      do {
        piVar1 = p->pObjData;
        if (piVar1 == (int *)0x0) {
          return;
        }
        lVar4 = (long)pVVar3->pArray[lVar5];
        uVar2 = Gia_ManRandom(0);
        if ((float)(uVar2 & 0xffff) * 1.5258789e-05 < PiTransProb) {
          Vec_IntPush(p->vCisChanged,piVar1[lVar4 + 1]);
          *(byte *)(piVar1 + lVar4) = *(byte *)(piVar1 + lVar4) ^ 6;
          piVar1[lVar4 + 5] = piVar1[lVar4 + 5] + 1;
          piVar1[lVar4 + 6] = piVar1[lVar4 + 6] + 1;
        }
        lVar5 = lVar5 + 1;
        pVVar3 = p->vCis;
      } while (lVar5 < pVVar3->nSize);
    }
    return;
  }
  __assert_fail("0.0 < PiTransProb && PiTransProb < 1.0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGlitch.c"
                ,0x1b0,"void Gli_ManSetPiRandom(Gli_Man_t *, float)");
}

Assistant:

void Gli_ManSetPiRandom( Gli_Man_t * p, float PiTransProb )
{
    Gli_Obj_t * pObj;
    float Multi = 1.0 / (1 << 16);
    int i;
    assert( 0.0 < PiTransProb && PiTransProb < 1.0 );
    Vec_IntClear( p->vCisChanged );
    Gli_ManForEachCi( p, pObj, i )
        if ( Multi * (Gia_ManRandom(0) & 0xffff) < PiTransProb )
        {
            Vec_IntPush( p->vCisChanged, pObj->Handle );
            pObj->fPhase  ^= 1;
            pObj->fPhase2 ^= 1;
            pObj->nSwitches++;
            pObj->nGlitches++;
        }
}